

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.c
# Opt level: O3

void receiver_run(receiver *rx,short *buf,int len)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  uint uVar5;
  uchar uVar6;
  ulong uVar7;
  uint uVar8;
  char b;
  float filtered [8192];
  char local_803d;
  float local_803c;
  float local_8038 [8194];
  
  if (0x2000 < len) {
    abort();
  }
  sVar1 = filter_run_buf(rx->filter,buf + rx->ch_ofs,local_8038,rx->num_ch,len);
  if (0 < len) {
    uVar7 = 0;
    do {
      uVar8 = (uint)(0.0 < local_8038[uVar7]);
      if ((rx->prev ^ uVar8) == 1) {
        uVar2 = rx->pll;
        uVar5 = rx->pllinc;
        if (uVar2 < 0x8000) {
          uVar2 = (uVar5 >> 4) + uVar2;
        }
        else {
          uVar2 = uVar2 - (uVar5 >> 4);
        }
      }
      else {
        uVar2 = rx->pll;
        uVar5 = rx->pllinc;
      }
      rx->prev = uVar8;
      rx->pll = uVar2 + uVar5;
      if (0xffff < uVar2 + uVar5) {
        local_803d = rx->lastbit == uVar8;
        protodec_decode(&local_803d,1,rx->decoder);
        rx->lastbit = uVar8;
        rx->pll = (uint)(ushort)rx->pll;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)len != uVar7);
  }
  local_803c = (float)(int)sVar1 * 3.0517578e-05 * 100.0;
  tVar4 = time((time_t *)0x0);
  iVar3 = (int)tVar4 - (int)rx->last_levellog;
  if (local_803c <= 95.0) {
    if (iVar3 < 1) {
      return;
    }
    if (on_sound_level_changed == (receiver_on_level_changed)0x0) goto LAB_00103443;
    iVar3 = rx->ch_ofs;
    uVar6 = '\0';
  }
  else {
    if (iVar3 < 1) {
      return;
    }
    if (on_sound_level_changed == (receiver_on_level_changed)0x0) goto LAB_00103443;
    iVar3 = rx->ch_ofs;
    uVar6 = '\x01';
  }
  (*on_sound_level_changed)(local_803c,iVar3,uVar6);
LAB_00103443:
  time(&rx->last_levellog);
  return;
}

Assistant:

void receiver_run(struct receiver *rx, short *buf, int len)
{
	float out;
	int curr, bit;
	char b;
	short maxval = 0;
	int level_distance;
	float level;
	int rx_num_ch = rx->num_ch;
    float filtered[FILTERED_LEN];
	int i;
	
	/* len is number of samples available in buffer for each
	 * channels - something like 1024, regardless of number of channels */
	
	buf += rx->ch_ofs;
	
	if (len > FILTERED_LEN)
		abort();

	maxval = filter_run_buf(rx->filter, buf, filtered, rx_num_ch, len);
	
	for (i = 0; i < len; i++) {
		out = filtered[i];
		curr = (out > 0);
		
		if ((curr ^ rx->prev) == 1) {
			if (rx->pll < (0x10000 / 2)) {
				rx->pll += rx->pllinc / INC;
			} else {
				rx->pll -= rx->pllinc / INC;
			}
		}
		rx->prev = curr;

		rx->pll += rx->pllinc;

		if (rx->pll > 0xffff) {
			/* slice */
			bit = (out > 0);
			/* nrzi decode */
			b = !(bit ^ rx->lastbit);
			/* feed to the decoder */
			protodec_decode(&b, 1, rx->decoder);

			rx->lastbit = bit;
			rx->pll &= 0xffff;
		}
	}
	
	/* calculate level, and log it */
	level = (float)maxval / (float)32768 * (float)100;
	level_distance = time(NULL) - rx->last_levellog;
	
    if (level > 95.0 && (level_distance >= 30 || level_distance >= sound_levellog)) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 1);
        time(&rx->last_levellog);
    } else if (sound_levellog != 0 && level_distance >= sound_levellog) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 0);
        time(&rx->last_levellog);
    }
}